

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

Value * __thiscall Json::Value::resolveReference(Value *this,char *key,bool isStatic)

{
  _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *this_00;
  int iVar1;
  iterator __pos;
  bool bVar2;
  CZString actualKey;
  value_type defaultValue;
  CZString local_58;
  pair<const_Json::Value::CZString,_Json::Value> local_48;
  
  if (this->field_0x8 == '\0') {
    Value((Value *)&local_48,objectValue);
    operator=(this,(Value *)&local_48);
    ~Value((Value *)&local_48);
  }
  else if (this->field_0x8 != '\a') {
    __assert_fail("type_ == nullValue || type_ == objectValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/jsoncpp/src/lib_json/json_value.cpp"
                  ,0x475,"Value &Json::Value::resolveReference(const char *, bool)");
  }
  CZString::CZString(&local_58,key,(uint)!isStatic * 2);
  this_00 = &((this->value_).map_)->_M_t;
  __pos = std::
          _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
          ::_M_lower_bound(this_00,(_Link_type)
                                   (this_00->_M_impl).super__Rb_tree_header._M_header._M_parent,
                           &(this_00->_M_impl).super__Rb_tree_header._M_header,&local_58);
  if ((_Rb_tree_header *)__pos._M_node !=
      &(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header) {
    if (*(char **)(__pos._M_node + 1) == (char *)0x0) {
      bVar2 = *(ArrayIndex *)&__pos._M_node[1]._M_parent == local_58.index_;
    }
    else {
      iVar1 = strcmp(*(char **)(__pos._M_node + 1),local_58.cstr_);
      bVar2 = iVar1 == 0;
    }
    if (bVar2) goto LAB_001e384e;
  }
  CZString::CZString(&local_48.first,&local_58);
  Value(&local_48.second,(Value *)null);
  __pos = std::
          _Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
          ::_M_emplace_hint_unique<std::pair<Json::Value::CZString_const,Json::Value>&>
                    ((_Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
                      *)(this->value_).map_,__pos._M_node,&local_48);
  ~Value(&local_48.second);
  CZString::~CZString(&local_48.first);
LAB_001e384e:
  CZString::~CZString(&local_58);
  return (Value *)&__pos._M_node[1]._M_left;
}

Assistant:

Value &
Value::resolveReference( const char *key, 
                         bool isStatic )
{
   JSON_ASSERT( type_ == nullValue  ||  type_ == objectValue );
   if ( type_ == nullValue )
      *this = Value( objectValue );
#ifndef JSON_VALUE_USE_INTERNAL_MAP
   CZString actualKey( key, isStatic ? CZString::noDuplication 
                                     : CZString::duplicateOnCopy );
   ObjectValues::iterator it = value_.map_->lower_bound( actualKey );
   if ( it != value_.map_->end()  &&  (*it).first == actualKey )
      return (*it).second;

   ObjectValues::value_type defaultValue( actualKey, null );
   it = value_.map_->insert( it, defaultValue );
   Value &value = (*it).second;
   return value;
#else
   return value_.map_->resolveReference( key, isStatic );
#endif
}